

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ParamDict * __thiscall ncnn::ParamDict::operator=(ParamDict *this,ParamDict *rhs)

{
  int iVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  int type;
  int i;
  int iVar2;
  
  if (in_RDI != in_RSI) {
    for (iVar2 = 0; iVar2 < 0x20; iVar2 = iVar2 + 1) {
      iVar1 = in_RSI->refcount[(long)iVar2 * 0x14];
      ((ParamDictPrivate *)in_RDI->refcount)->params[iVar2].type = iVar1;
      if (((iVar1 == 1) || (iVar1 == 2)) || (iVar1 == 3)) {
        ((ParamDictPrivate *)in_RDI->refcount)->params[iVar2].field_1 =
             *(anon_union_4_2_947300a4_for_anon_struct_80_3_b6d6cd30_1 *)
              (in_RSI->refcount + (long)iVar2 * 0x14 + 1);
      }
      else {
        ncnn::Mat::operator=(in_RSI,(Mat *)CONCAT44(iVar2,iVar1));
      }
    }
  }
  return (ParamDict *)in_RDI;
}

Assistant:

ParamDict& ParamDict::operator=(const ParamDict& rhs)
{
    if (this == &rhs)
        return *this;

    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }

    return *this;
}